

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001be000 = 0x2d2d2d2d2d2d2d;
    uRam00000000001be007._0_1_ = '-';
    uRam00000000001be007._1_1_ = '-';
    uRam00000000001be007._2_1_ = '-';
    uRam00000000001be007._3_1_ = '-';
    uRam00000000001be007._4_1_ = '-';
    uRam00000000001be007._5_1_ = '-';
    uRam00000000001be007._6_1_ = '-';
    uRam00000000001be007._7_1_ = '-';
    DAT_001bdff0 = '-';
    DAT_001bdff0_1._0_1_ = '-';
    DAT_001bdff0_1._1_1_ = '-';
    DAT_001bdff0_1._2_1_ = '-';
    DAT_001bdff0_1._3_1_ = '-';
    DAT_001bdff0_1._4_1_ = '-';
    DAT_001bdff0_1._5_1_ = '-';
    DAT_001bdff0_1._6_1_ = '-';
    uRam00000000001bdff8 = 0x2d2d2d2d2d2d2d;
    DAT_001bdfff = 0x2d;
    DAT_001bdfe0 = '-';
    DAT_001bdfe0_1._0_1_ = '-';
    DAT_001bdfe0_1._1_1_ = '-';
    DAT_001bdfe0_1._2_1_ = '-';
    DAT_001bdfe0_1._3_1_ = '-';
    DAT_001bdfe0_1._4_1_ = '-';
    DAT_001bdfe0_1._5_1_ = '-';
    DAT_001bdfe0_1._6_1_ = '-';
    uRam00000000001bdfe8._0_1_ = '-';
    uRam00000000001bdfe8._1_1_ = '-';
    uRam00000000001bdfe8._2_1_ = '-';
    uRam00000000001bdfe8._3_1_ = '-';
    uRam00000000001bdfe8._4_1_ = '-';
    uRam00000000001bdfe8._5_1_ = '-';
    uRam00000000001bdfe8._6_1_ = '-';
    uRam00000000001bdfe8._7_1_ = '-';
    DAT_001bdfd0 = '-';
    DAT_001bdfd0_1._0_1_ = '-';
    DAT_001bdfd0_1._1_1_ = '-';
    DAT_001bdfd0_1._2_1_ = '-';
    DAT_001bdfd0_1._3_1_ = '-';
    DAT_001bdfd0_1._4_1_ = '-';
    DAT_001bdfd0_1._5_1_ = '-';
    DAT_001bdfd0_1._6_1_ = '-';
    uRam00000000001bdfd8._0_1_ = '-';
    uRam00000000001bdfd8._1_1_ = '-';
    uRam00000000001bdfd8._2_1_ = '-';
    uRam00000000001bdfd8._3_1_ = '-';
    uRam00000000001bdfd8._4_1_ = '-';
    uRam00000000001bdfd8._5_1_ = '-';
    uRam00000000001bdfd8._6_1_ = '-';
    uRam00000000001bdfd8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001bdfc8._0_1_ = '-';
    uRam00000000001bdfc8._1_1_ = '-';
    uRam00000000001bdfc8._2_1_ = '-';
    uRam00000000001bdfc8._3_1_ = '-';
    uRam00000000001bdfc8._4_1_ = '-';
    uRam00000000001bdfc8._5_1_ = '-';
    uRam00000000001bdfc8._6_1_ = '-';
    uRam00000000001bdfc8._7_1_ = '-';
    DAT_001be00f = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}